

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void fullsize_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY output_data)

{
  JSAMPARRAY output_data_local;
  JSAMPARRAY input_data_local;
  jpeg_component_info *compptr_local;
  j_compress_ptr cinfo_local;
  
  jcopy_sample_rows(input_data,0,output_data,0,cinfo->max_v_samp_factor,cinfo->image_width);
  expand_right_edge(output_data,cinfo->max_v_samp_factor,cinfo->image_width,
                    compptr->width_in_blocks * compptr->DCT_h_scaled_size);
  return;
}

Assistant:

METHODDEF(void)
fullsize_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		     JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  /* Copy the data */
  jcopy_sample_rows(input_data, 0, output_data, 0,
		    cinfo->max_v_samp_factor, cinfo->image_width);
  /* Edge-expand */
  expand_right_edge(output_data, cinfo->max_v_samp_factor, cinfo->image_width,
		    compptr->width_in_blocks * compptr->DCT_h_scaled_size);
}